

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::AssertControlTask::AssertControlTask(AssertControlTask *this,string *name)

{
  bool bVar1;
  
  SystemTaskBase::SystemTaskBase(&this->super_SystemTaskBase,name);
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00477980;
  bVar1 = std::operator==(name,"$assertcontrol");
  (this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 = bVar1;
  return;
}

Assistant:

explicit AssertControlTask(const std::string& name) :
        SystemTaskBase(name), isFullMethod(name == "$assertcontrol") {}